

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::setLoggingCallback
          (CoreBroker *this,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *logFunction)

{
  uint16_t uVar1;
  ActionMessage loggerUpdate;
  ActionMessage AStack_d8;
  
  ActionMessage::ActionMessage(&AStack_d8,cmd_broker_configure);
  AStack_d8.messageID = 0x250;
  AStack_d8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  if ((logFunction->super__Function_base)._M_manager == (_Manager_type)0x0) {
    AStack_d8.flags._1_1_ = AStack_d8.flags._1_1_ | 0x80;
  }
  else {
    uVar1 = getNextAirlockIndex(this);
    gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
    load<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
              ((AirLock<std::any,std::mutex,std::condition_variable> *)
               ((this->dataAirlocks)._M_elems + uVar1),
               (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)logFunction);
    AStack_d8.counter = uVar1;
  }
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
             &(this->super_BrokerBase).actionQueue,&AStack_d8);
  ActionMessage::~ActionMessage(&AStack_d8);
  return;
}

Assistant:

void CoreBroker::setLoggingCallback(
    std::function<void(int, std::string_view, std::string_view)> logFunction)
{
    ActionMessage loggerUpdate(CMD_BROKER_CONFIGURE);
    loggerUpdate.messageID = UPDATE_LOGGING_CALLBACK;
    loggerUpdate.source_id = global_id.load();
    if (logFunction) {
        auto index = getNextAirlockIndex();
        dataAirlocks[index].load(std::move(logFunction));
        loggerUpdate.counter = index;
    } else {
        setActionFlag(loggerUpdate, empty_flag);
    }

    actionQueue.push(loggerUpdate);
}